

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintC::emitBlockSwitch(PrintC *this,BlockSwitch *bl)

{
  uint4 *puVar1;
  byte *pbVar2;
  FlowBlock *pFVar3;
  pointer puVar4;
  EmitXml *pEVar5;
  pointer pCVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int4 i;
  ulong uVar10;
  
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  puVar1 = &(this->super_PrintLanguage).mods;
  *puVar1 = *puVar1 & 0xfffffe7f;
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  puVar1 = &(this->super_PrintLanguage).mods;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  pFVar3 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar3->_vptr_FlowBlock[0xc])(pFVar3,this);
  puVar4 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar5 = (this->super_PrintLanguage).emit;
  (this->super_PrintLanguage).mods = puVar4[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar4 + -1;
  (*pEVar5->_vptr_EmitXml[8])();
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  pbVar2 = (byte *)((long)&(this->super_PrintLanguage).mods + 1);
  *pbVar2 = *pbVar2 | 3;
  pFVar3 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar3->_vptr_FlowBlock[0xc])(pFVar3,this);
  puVar4 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar5 = (this->super_PrintLanguage).emit;
  (this->super_PrintLanguage).mods = puVar4[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar4 + -1;
  lVar9 = 0;
  (*pEVar5->_vptr_EmitXml[0x21])(pEVar5,1,0);
  pEVar5 = (this->super_PrintLanguage).emit;
  (*pEVar5->_vptr_EmitXml[0x19])(pEVar5,"{",8);
  for (uVar10 = 0;
      (long)uVar10 <
      (long)(int)(((long)(bl->caseblocks).
                         super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(bl->caseblocks).
                        super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar10 = uVar10 + 1) {
    emitSwitchCase(this,(int4)uVar10,bl);
    uVar7 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
    pCVar6 = (bl->caseblocks).
             super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)&pCVar6->gototype + lVar9) == 0) {
      pFVar3 = *(FlowBlock **)((long)&pCVar6->block + lVar9);
      pEVar5 = (this->super_PrintLanguage).emit;
      uVar8 = (*pEVar5->_vptr_EmitXml[6])(pEVar5,pFVar3);
      (*pFVar3->_vptr_FlowBlock[0xc])(pFVar3,this);
      pCVar6 = (bl->caseblocks).
               super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((&pCVar6->isexit)[lVar9] == true) {
        if (uVar10 != (int)(((long)(bl->caseblocks).
                                   super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar6) / 0x30
                           ) - 1) {
          (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
          emitGotoStatement(this,pFVar3,(FlowBlock *)0x0,2);
        }
      }
      pEVar5 = (this->super_PrintLanguage).emit;
      (*pEVar5->_vptr_EmitXml[7])(pEVar5,(ulong)uVar8);
    }
    else {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
      pCVar6 = (bl->caseblocks).
               super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      emitGotoStatement(this,*(bl->super_BlockGraph).list.
                              super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                              super__Vector_impl_data._M_start,
                        *(FlowBlock **)((long)&pCVar6->block + lVar9),
                        *(uint4 *)((long)&pCVar6->gototype + lVar9));
    }
    pEVar5 = (this->super_PrintLanguage).emit;
    (*pEVar5->_vptr_EmitXml[0x23])(pEVar5,(ulong)uVar7);
    lVar9 = lVar9 + 0x30;
  }
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar5 = (this->super_PrintLanguage).emit;
  (*pEVar5->_vptr_EmitXml[0x19])(pEVar5,"}",8);
  puVar4 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_PrintLanguage).mods = puVar4[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar4 + -1;
  return;
}

Assistant:

void PrintC::emitBlockSwitch(const BlockSwitch *bl)

{
  FlowBlock *bl2;

  pushMod();
  unsetMod(no_branch|only_branch);
  pushMod();
  setMod(no_branch);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->tagLine();
  pushMod();
  setMod(only_branch|comma_separate);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->spaces(1);
  emit->print("{");

  for(int4 i=0;i<bl->getNumCaseBlocks();++i) {
    emitSwitchCase(i,bl);
    int4 id = emit->startIndent();
    if (bl->getGotoType(i)!=0) {
      emit->tagLine();
      emitGotoStatement(bl->getBlock(0),bl->getCaseBlock(i),bl->getGotoType(i));
    }
    else {
      bl2 = bl->getCaseBlock(i);
      int4 id2 = emit->beginBlock(bl2);
      bl2->emit(this);
      if (bl->isExit(i)&&(i!=bl->getNumCaseBlocks()-1)) {	// Blocks that formally exit the switch
	emit->tagLine();
	emitGotoStatement(bl2,(const FlowBlock *)0,FlowBlock::f_break_goto); // need an explicit break statement
      }
      emit->endBlock(id2);
    }
    emit->stopIndent(id);
  }
  emit->tagLine();
  emit->print("}");
  popMod();
}